

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::compareStencilToRed
          (anon_unknown_1 *this,TestLog *log,ConstPixelBufferAccess *stencilRef,
          ConstPixelBufferAccess *result)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  ConstPixelBufferAccess *__n;
  LogImageSet *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar4;
  char *pcVar5;
  int y;
  uint y_00;
  int x;
  allocator<char> local_299;
  anon_unknown_1 *local_298;
  allocator<char> local_28b;
  allocator<char> local_28a;
  allocator<char> local_289;
  ConstPixelBufferAccess *local_288;
  ConstPixelBufferAccess *local_280;
  IVec3 *local_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  LogImageSet local_1f0;
  MessageBuilder local_1b0;
  
  local_278 = (IVec3 *)(log + 1);
  iVar4 = 0;
  poVar1 = &local_1b0.m_str;
  y_00 = 0;
  local_298 = this;
  local_288 = (ConstPixelBufferAccess *)log;
  local_280 = stencilRef;
  do {
    if ((local_288->m_size).m_data[1] <= (int)y_00) {
      poVar1 = &local_1b0.m_str;
      local_1b0.m_log = (TestLog *)local_298;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Found ");
      std::ostream::operator<<(poVar1,iVar4);
      std::operator<<((ostream *)poVar1," faulty pixels, comparison ");
      pcVar5 = "FAILED!";
      if (iVar4 == 0) {
        pcVar5 = "passed.";
      }
      std::operator<<((ostream *)poVar1,pcVar5);
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"ComparisonResult",&local_299);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"Image comparison result",&local_289);
      tcu::LogImageSet::LogImageSet(&local_1f0,&local_250,&local_270);
      tcu::LogImageSet::write(&local_1f0,(int)local_298,__buf,(size_t)result);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Result",&local_28a);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"Result stencil buffer",&local_28b);
      __n = local_280;
      tcu::LogImage::LogImage
                ((LogImage *)&local_1b0,&local_210,&local_230,local_280,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&local_1b0,(int)local_298,__buf_00,(size_t)__n);
      tcu::LogImage::~LogImage((LogImage *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      tcu::LogImageSet::~LogImageSet(&local_1f0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
      if (0 < iVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"Reference",(allocator<char> *)&local_230);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,"Reference stencil buffer",&local_299);
        local_210._M_dataplus._M_p = (pointer)0x1e00000000;
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&local_1f0,(TextureFormat *)&local_210,local_278,
                   &local_288->m_pitch,local_288->m_data);
        access = &local_1f0;
        tcu::LogImage::LogImage
                  ((LogImage *)&local_1b0,&local_250,&local_270,(ConstPixelBufferAccess *)access,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&local_1b0,(int)local_298,__buf_01,(size_t)access);
        tcu::LogImage::~LogImage((LogImage *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_250);
      }
      tcu::TestLog::endImageSet((TestLog *)local_298);
      return iVar4 == 0;
    }
    for (x = 0; x < local_278->m_data[0]; x = x + 1) {
      iVar3 = tcu::ConstPixelBufferAccess::getPixStencil(local_288,x,y_00,0);
      result = (ConstPixelBufferAccess *)(ulong)y_00;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&local_1b0,(int)local_280,x,y_00);
      iVar2 = (int)local_1b0.m_log;
      if (iVar3 != (int)local_1b0.m_log) {
        if (iVar4 < 10) {
          local_1b0.m_log = (TestLog *)local_298;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,"ERROR: Expected ");
          std::ostream::operator<<(poVar1,iVar3);
          std::operator<<((ostream *)poVar1,", got ");
          std::ostream::operator<<(poVar1,iVar2);
          std::operator<<((ostream *)poVar1," at (");
          std::ostream::operator<<(poVar1,x);
          std::operator<<((ostream *)poVar1,", ");
          std::ostream::operator<<(poVar1,y_00);
          std::operator<<((ostream *)poVar1,")");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00483409:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
        }
        else if (iVar4 == 10) {
          local_1b0.m_log = (TestLog *)local_298;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
          std::operator<<((ostream *)&local_1b0.m_str,"...");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00483409;
        }
        iVar4 = iVar4 + 1;
      }
    }
    y_00 = y_00 + 1;
  } while( true );
}

Assistant:

static bool compareStencilToRed (tcu::TestLog& log, const tcu::ConstPixelBufferAccess& stencilRef, const tcu::ConstPixelBufferAccess& result)
{
	const int		maxPrints		= 10;
	int				numFailed		= 0;

	DE_ASSERT(stencilRef.getFormat().order == TextureFormat::S);
	DE_ASSERT(stencilRef.getWidth() == result.getWidth() && stencilRef.getHeight() == result.getHeight());

	for (int y = 0; y < stencilRef.getHeight(); y++)
	{
		for (int x = 0; x < stencilRef.getWidth(); x++)
		{
			const int		ref		= stencilRef.getPixStencil(x, y);
			const int		res		= result.getPixelInt(x, y).x();

			if (ref != res)
			{
				if (numFailed < maxPrints)
					log << TestLog::Message << "ERROR: Expected " << ref << ", got " << res << " at (" << x << ", " << y << ")" << TestLog::EndMessage;
				else if (numFailed == maxPrints)
					log << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}
	}

	log << TestLog::Message << "Found " << numFailed << " faulty pixels, comparison " << (numFailed == 0 ? "passed." : "FAILED!") << TestLog::EndMessage;

	log << TestLog::ImageSet("ComparisonResult", "Image comparison result")
		<< TestLog::Image("Result", "Result stencil buffer", result);

	if (numFailed > 0)
		log << TestLog::Image("Reference", "Reference stencil buffer", stencilToRedAccess(stencilRef));

	log << TestLog::EndImageSet;

	return numFailed == 0;
}